

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxu32 MemHashFunc(void *pSrc,sxu32 nLen)

{
  sxu32 sVar1;
  byte *pbVar2;
  sxu32 local_2c;
  sxu32 nH;
  uchar *zEnd;
  uchar *zIn;
  sxu32 nLen_local;
  void *pSrc_local;
  
  local_2c = 0x1505;
  pbVar2 = (byte *)((long)pSrc + (ulong)nLen);
  zEnd = (uchar *)pSrc;
  while( true ) {
    if (pbVar2 <= zEnd) {
      return local_2c;
    }
    sVar1 = local_2c * 0x21 + (uint)*zEnd;
    if (pbVar2 <= zEnd + 1) {
      return sVar1;
    }
    sVar1 = sVar1 * 0x21 + (uint)zEnd[1];
    if (pbVar2 <= zEnd + 2) {
      return sVar1;
    }
    sVar1 = sVar1 * 0x21 + (uint)zEnd[2];
    if (pbVar2 <= zEnd + 3) break;
    local_2c = sVar1 * 0x21 + (uint)zEnd[3];
    zEnd = zEnd + 4;
  }
  return sVar1;
}

Assistant:

static sxu32 MemHashFunc(const void *pSrc,sxu32 nLen)
{
	register unsigned char *zIn = (unsigned char *)pSrc;
	unsigned char *zEnd;
	sxu32 nH = 5381;
	zEnd = &zIn[nLen];
	for(;;){
		if( zIn >= zEnd ){ break; } nH = nH * 33 + zIn[0] ; zIn++;
		if( zIn >= zEnd ){ break; } nH = nH * 33 + zIn[0] ; zIn++;
		if( zIn >= zEnd ){ break; } nH = nH * 33 + zIn[0] ; zIn++;
		if( zIn >= zEnd ){ break; } nH = nH * 33 + zIn[0] ; zIn++;
	}	
	return nH;
}